

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

bool __thiscall mkvmuxer::SeekHead::AddSeekEntry(SeekHead *this,uint32_t id,uint64_t pos)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  
  if (this->seek_entry_id_[0] == 0) {
    bVar3 = true;
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    do {
      uVar1 = uVar2;
      if (uVar1 == 4) {
        return false;
      }
      uVar2 = uVar1 + 1;
    } while (this->seek_entry_id_[uVar1 + 1] != 0);
    bVar3 = uVar1 < 4;
  }
  this->seek_entry_id_[uVar2] = id;
  this->seek_entry_pos_[uVar2] = pos;
  return bVar3;
}

Assistant:

bool SeekHead::AddSeekEntry(uint32_t id, uint64_t pos) {
  for (int32_t i = 0; i < kSeekEntryCount; ++i) {
    if (seek_entry_id_[i] == 0) {
      seek_entry_id_[i] = id;
      seek_entry_pos_[i] = pos;
      return true;
    }
  }
  return false;
}